

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

void __thiscall
wasm::RemoveUnusedBrs::doWalkFunction(wasm::Function*)::JumpThreader::redirectBranches(wasm::
Block*,wasm::Name_(void *this,Block *from,Name to)

{
  Name to_00;
  bool bVar1;
  mapped_type *pmVar2;
  reference ppEVar3;
  Expression *local_90;
  Expression *branch_1;
  iterator __end3_1;
  iterator __begin3_1;
  mapped_type *__range3_1;
  Expression *branch;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  mapped_type *branches;
  Block *from_local;
  JumpThreader *this_local;
  Name to_local;
  
  to_local.super_IString.str._M_len = to.super_IString.str._M_str;
  this_local = to.super_IString.str._M_len;
  pmVar2 = std::
           unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
           ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                         *)((long)this + 0xd8),&from->name);
  __end3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin(pmVar2);
  branch = (Expression *)
           std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end(pmVar2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                     *)&branch), bVar1) {
    ppEVar3 = __gnu_cxx::
              __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
              ::operator*(&__end3);
    to_00.super_IString.str._M_str = (char *)to_local.super_IString.str._M_len;
    to_00.super_IString.str._M_len = (size_t)this_local;
    bVar1 = BranchUtils::replacePossibleTarget(*ppEVar3,(Name)(from->name).super_IString.str,to_00);
    if (bVar1) {
      *(undefined1 *)((long)this + 0x110) = 1;
    }
    __gnu_cxx::
    __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
    ::operator++(&__end3);
  }
  __end3_1 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin(pmVar2);
  branch_1 = (Expression *)
             std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end(pmVar2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3_1,
                            (__normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                             *)&branch_1), bVar1) {
    ppEVar3 = __gnu_cxx::
              __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
              ::operator*(&__end3_1);
    local_90 = *ppEVar3;
    pmVar2 = std::
             unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
             ::operator[]((unordered_map<wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>_>_>
                           *)((long)this + 0xd8),(key_type *)&this_local);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (pmVar2,&local_90);
    __gnu_cxx::
    __normal_iterator<wasm::Expression_**,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
    ::operator++(&__end3_1);
  }
  return;
}

Assistant:

void redirectBranches(Block* from, Name to) {
        auto& branches = labelToBranches[from->name];
        for (auto* branch : branches) {
          if (BranchUtils::replacePossibleTarget(branch, from->name, to)) {
            worked = true;
          }
        }
        // if the jump is to another block then we can update the list, and
        // maybe push it even more later
        for (auto* branch : branches) {
          labelToBranches[to].push_back(branch);
        }
      }